

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_file_read(lua_State *L,IOFileUD *iof,int start)

{
  byte bVar1;
  FILE *__stream;
  TValue *pTVar2;
  TValue *pTVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  GCstr *pGVar10;
  MSize sz;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  TValue local_38;
  
  __stream = (FILE *)iof->fp;
  pTVar2 = L->top;
  pTVar3 = L->base;
  clearerr(__stream);
  iVar12 = (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - start;
  if (iVar12 == 0) {
    uVar4 = io_file_readline(L,(FILE *)__stream,1);
    uVar11 = (ulong)(start + 1);
  }
  else {
    luaL_checkstack(L,iVar12 + 0x14,"too many arguments");
    uVar11 = (ulong)start;
    uVar4 = 1;
    do {
      uVar6 = *(uint *)((long)L->base + uVar11 * 8 + 4);
      if (uVar6 == 0xfffffffb) {
        uVar7 = (ulong)L->base[uVar11].u32.lo;
        bVar1 = *(byte *)(uVar7 + 0x10 + (ulong)(*(char *)(uVar7 + 0x10) == '*'));
        if (bVar1 == 0x6e) {
          iVar5 = __isoc99_fscanf(__stream,"%lf",&local_38);
          if (iVar5 == 1) {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            *pTVar2 = local_38;
            uVar4 = 1;
          }
          else {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            (pTVar2->field_2).it = 0xffffffff;
            uVar4 = 0;
          }
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          uVar4 = io_file_readline(L,(FILE *)__stream,(uint)(bVar1 == 0x6c));
        }
        else {
          if (bVar1 != 0x61) {
            lj_err_arg(L,(int)uVar11 + 1,LJ_ERR_INVFMT);
          }
          uVar6 = 0;
          sz = 0x2000;
          do {
            pcVar8 = lj_buf_tmp(L,sz);
            sVar9 = fread(pcVar8 + uVar6,1,(ulong)(sz - uVar6),__stream);
            uVar6 = (int)sVar9 + uVar6;
            bVar13 = uVar6 == sz;
            sz = sz * 2;
          } while (bVar13);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,(ulong)uVar6);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
            lj_gc_step(L);
          }
        }
      }
      else {
        iVar5 = (int)uVar11 + 1;
        if (0xfffeffff < uVar6) {
          lj_err_arg(L,iVar5,LJ_ERR_INVOPT);
        }
        uVar4 = lj_lib_checkint(L,iVar5);
        if (uVar4 == 0) {
          iVar5 = getc(__stream);
          ungetc(iVar5,__stream);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          (pTVar2->u32).lo = (L->glref).ptr32 + 0xf8;
          (pTVar2->field_2).it = 0xfffffffb;
          bVar13 = iVar5 != -1;
        }
        else {
          pcVar8 = lj_buf_tmp(L,uVar4);
          sVar9 = fread(pcVar8,1,(ulong)uVar4,__stream);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,sVar9 & 0xffffffff);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
            lj_gc_step(L);
          }
          bVar13 = (sVar9 & 0xffffffff) != 0;
        }
        uVar4 = (uint)bVar13;
      }
      iVar12 = iVar12 + -1;
      uVar11 = uVar11 + 1;
    } while ((iVar12 != 0) && (uVar4 != 0));
  }
  iVar12 = ferror(__stream);
  if (iVar12 == 0) {
    if (uVar4 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
    }
    iVar12 = (int)uVar11 - start;
  }
  else {
    iVar12 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar12;
}

Assistant:

static int io_file_read(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] == '*') p++;
	if (p[0] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[0] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[0] == 'l'));
	else if (p[0] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}